

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O1

void __thiscall luna::Lexer::LexComment(Lexer *this)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = Next(this);
  this->current_ = iVar1;
  if (iVar1 == 0x5b) {
    iVar1 = Next(this);
    this->current_ = iVar1;
    if (iVar1 == 0x5b) {
      LexMultiLineComment(this);
      return;
    }
    while ((uVar2 = this->current_ + 1, 0xe < uVar2 || ((0x4801U >> (uVar2 & 0x1f) & 1) == 0))) {
      iVar1 = Next(this);
      this->current_ = iVar1;
    }
  }
  else {
    while ((uVar2 = this->current_ + 1, 0xe < uVar2 || ((0x4801U >> (uVar2 & 0x1f) & 1) == 0))) {
      iVar1 = Next(this);
      this->current_ = iVar1;
    }
  }
  return;
}

Assistant:

void Lexer::LexComment()
    {
        current_ = Next();
        if (current_ == '[')
        {
            current_ = Next();
            if (current_ == '[')
                LexMultiLineComment();
            else
                LexSingleLineComment();
        }
        else
            LexSingleLineComment();
    }